

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LayerProvokingVertexQueryCase::iterate
          (LayerProvokingVertexQueryCase *this)

{
  pointer pcVar1;
  ostringstream *poVar2;
  TestLog *pTVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  GLint *pGVar6;
  ScopedLogSection section;
  CallLogWrapper gl;
  QueriedState state;
  ResultCollector result;
  ScopedLogSection local_258;
  CallLogWrapper local_250;
  QueriedState local_238;
  string local_210;
  ResultCollector local_1f0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_250,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pcVar1 = local_1a0 + 0x10;
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_1f0,pTVar3,(string *)local_1a0);
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  gls::StateQueryUtil::QueriedState::QueriedState(&local_238);
  local_250.m_enableLog = true;
  gls::StateQueryUtil::queryState(&local_1f0,&local_250,QUERY_INTEGER,0x825e,&local_238);
  bVar4 = gls::StateQueryUtil::QueriedState::isUndefined(&local_238);
  if (!bVar4) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"LAYER_PROVOKING_VERTEX = ",0x19);
    pGVar6 = gls::StateQueryUtil::QueriedState::getIntAccess(&local_238);
    local_210._M_string_length._0_4_ = *pGVar6;
    local_210._M_dataplus._M_p = (pointer)glu::getProvokingVertexName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_210,(ostream *)poVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_128);
    pGVar6 = gls::StateQueryUtil::QueriedState::getIntAccess(&local_238);
    if (*pGVar6 != 0x8e4d) {
      pGVar6 = gls::StateQueryUtil::QueriedState::getIntAccess(&local_238);
      if (*pGVar6 != 0x8e4e) {
        pGVar6 = gls::StateQueryUtil::QueriedState::getIntAccess(&local_238);
        if (*pGVar6 != 0x8260) {
          local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar2 = (ostringstream *)(local_1a0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,
                     "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got ",0x42);
          pGVar6 = gls::StateQueryUtil::QueriedState::getIntAccess(&local_238);
          std::ostream::operator<<(poVar2,*pGVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,
                     "Expected any of {FIRST_VERTEX_CONVENTION, LAST_VERTEX_CONVENTION, UNDEFINED_VERTEX}."
                     ,0x54);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base(local_128);
          local_1a0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a0,"got unexpected provoking vertex value","");
          tcu::ResultCollector::fail(&local_1f0,(string *)local_1a0);
          if ((pointer)local_1a0._0_8_ != pcVar1) {
            operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
          }
        }
      }
    }
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_1a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"Types","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Alternative queries","");
    tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar3,(string *)local_1a0,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a0._0_8_ != pcVar1) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    pGVar6 = gls::StateQueryUtil::QueriedState::getIntAccess(&local_238);
    gls::StateQueryUtil::verifyStateInteger(&local_1f0,&local_250,0x825e,*pGVar6,QUERY_BOOLEAN);
    pGVar6 = gls::StateQueryUtil::QueriedState::getIntAccess(&local_238);
    gls::StateQueryUtil::verifyStateInteger(&local_1f0,&local_250,0x825e,*pGVar6,QUERY_INTEGER64);
    pGVar6 = gls::StateQueryUtil::QueriedState::getIntAccess(&local_238);
    gls::StateQueryUtil::verifyStateInteger(&local_1f0,&local_250,0x825e,*pGVar6,QUERY_FLOAT);
    tcu::TestLog::endSection(local_258.m_log);
  }
  tcu::ResultCollector::setTestContextResult
            (&local_1f0,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_prefix._M_dataplus._M_p != &local_1f0.m_prefix.field_2) {
    operator_delete(local_1f0.m_prefix._M_dataplus._M_p,
                    local_1f0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_250);
  return STOP;
}

Assistant:

LayerProvokingVertexQueryCase::IterateResult LayerProvokingVertexQueryCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	QueriedState			state;

	gl.enableLogging(true);
	queryState(result, gl, QUERY_INTEGER, GL_LAYER_PROVOKING_VERTEX, state);

	if (!state.isUndefined())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "LAYER_PROVOKING_VERTEX = " << glu::getProvokingVertexStr(state.getIntAccess()) << tcu::TestLog::EndMessage;

		if (state.getIntAccess() != GL_FIRST_VERTEX_CONVENTION &&
			state.getIntAccess() != GL_LAST_VERTEX_CONVENTION &&
			state.getIntAccess() != GL_UNDEFINED_VERTEX)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got "
				<< state.getIntAccess() << "\n"
				<< "Expected any of {FIRST_VERTEX_CONVENTION, LAST_VERTEX_CONVENTION, UNDEFINED_VERTEX}."
				<< tcu::TestLog::EndMessage;

			result.fail("got unexpected provoking vertex value");
		}

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_BOOLEAN);
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_INTEGER64);
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}